

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

VoidPromiseAndPipeline * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::startCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,RpcConnectionState *this,
          uint64_t interfaceId,uint64_t methodId,Own<capnp::ClientHook> *capability,
          Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  int iVar2;
  TransformPromiseNodeBase *this_00;
  AttachmentPromiseNodeBase *this_01;
  undefined4 extraout_var;
  MessageSizeCounts MVar3;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  Disposer *local_128;
  WirePointer *pWStack_120;
  StructDataBitCount local_118;
  StructPointerCount SStack_114;
  undefined2 uStack_112;
  int iStack_110;
  undefined4 uStack_10c;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  request;
  Own<kj::_::PromiseNode> local_c8;
  Own<kj::_::PromiseNode> local_b8;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> local_a8;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_kj::Own<capnp::ClientHook>_>_>_>
  local_98;
  ReaderFor<capnp::Persistent<>::SaveParams> params;
  Own<kj::_::PromiseNode> local_58;
  Maybe<capnp::MessageSize> local_48;
  
  if ((interfaceId == 0xc8cb212fcd9f5691 && methodId == 0) && ((this->gateway).ptr.isSet == true)) {
    (*capability->ptr->_vptr_ClientHook[3])(&request);
    local_158[0] = request.super_Builder._builder.segment._0_1_;
    if (request.super_Builder._builder.segment._0_1_ == true) {
      local_158._8_8_ = request.super_Builder._builder.capTable;
      local_158._16_8_ = request.super_Builder._builder.data;
      request.super_Builder._builder.data = (void *)0x0;
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)&request);
    if ((bool)local_158[0] == true) {
      request.super_Builder._builder.capTable = (CapTableBuilder *)0xc8cb212fcd9f5691;
      request.super_Builder._builder.data = (void *)0x0;
      request.super_Builder._builder.pointers = (WirePointer *)context->disposer;
      request.super_Builder._builder._32_8_ = context->ptr;
      context->ptr = (CallContextHook *)0x0;
      request.super_Builder._builder.segment = (SegmentBuilder *)this;
      this_00 = (TransformPromiseNodeBase *)operator_new(0x50);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(Own<kj::_::PromiseNode> *)(local_158 + 8),
                 kj::
                 CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>
                 ::operator());
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670408;
      this_00[1].super_PromiseNode._vptr_PromiseNode =
           (_func_int **)request.super_Builder._builder.segment;
      this_00[1].dependency.disposer = (Disposer *)request.super_Builder._builder.capTable;
      this_00[1].dependency.ptr = (PromiseNode *)request.super_Builder._builder.data;
      this_00[1].continuationTracePtr = request.super_Builder._builder.pointers;
      this_00[2].super_PromiseNode._vptr_PromiseNode =
           (_func_int **)request.super_Builder._builder._32_8_;
      request.super_Builder._builder.dataSize = 0;
      request.super_Builder._builder.pointerCount = 0;
      request.super_Builder._builder._38_2_ = 0;
      local_138._0_8_ =
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>>
            ::instance;
      local_58.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>>
            ::instance;
      local_138._8_8_ = (RpcConnectionState *)0x0;
      local_c8.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>>
            ::instance;
      local_58.ptr = (PromiseNode *)0x0;
      local_c8.ptr = (PromiseNode *)this_00;
      kj::Own<kj::_::PromiseNode>::dispose(&local_58);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_138);
      puVar1 = &(this->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      local_138._0_8_ = &this->super_Refcounted;
      local_a8.ptr = (RpcConnectionState *)0x0;
      local_128 = capability->disposer;
      pWStack_120 = (WirePointer *)capability->ptr;
      capability->ptr = (ClientHook *)0x0;
      local_138._8_8_ = this;
      local_a8.disposer = (Disposer *)local_138._0_8_;
      this_01 = (AttachmentPromiseNodeBase *)operator_new(0x38);
      kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_01,&local_c8);
      (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00670490;
      this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_138._0_8_;
      this_01[1].dependency.disposer = (Disposer *)local_138._8_8_;
      local_138._8_8_ = (RpcConnectionState *)0x0;
      this_01[1].dependency.ptr = (PromiseNode *)local_128;
      this_01[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pWStack_120;
      pWStack_120 = (WirePointer *)0x0;
      local_98.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>>>
            ::instance;
      local_58.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>>>
            ::instance;
      local_98.ptr = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_kj::Own<capnp::ClientHook>_>_>
                      *)0x0;
      local_b8.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>>>
            ::instance;
      local_58.ptr = (PromiseNode *)0x0;
      local_b8.ptr = (PromiseNode *)this_01;
      kj::Own<kj::_::PromiseNode>::dispose(&local_58);
      kj::
      Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_kj::Own<capnp::ClientHook>_>_>_>
      ::~Own(&local_98);
      kj::_::
      Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_kj::Own<capnp::ClientHook>_>
      ::~Tuple((Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_kj::Own<capnp::ClientHook>_>
                *)local_138);
      kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::split
                ((SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>
                  *)&params,
                 (Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)
                 &local_b8);
      kj::Own<kj::_::PromiseNode>::dispose(&local_b8);
      kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own(&local_a8);
      kj::Own<kj::_::PromiseNode>::dispose(&local_c8);
      kj::Own<capnp::CallContextHook>::dispose
                ((Own<capnp::CallContextHook> *)&request.super_Builder._builder.pointers);
      (__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
           (Disposer *)params._reader.segment;
      (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
           (PromiseNode *)params._reader.capTable;
      params._reader.capTable = (CapTableReader *)0x0;
      newLocalPromisePipeline
                ((capnp *)&__return_storage_ptr__->pipeline,
                 (Promise<kj::Own<capnp::PipelineHook>_> *)&params._reader.data);
      kj::_::
      TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
      ::~TupleImpl((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
                    *)&params);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_158);
    }
    else {
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_158);
      iVar2 = (*capability->ptr->_vptr_ClientHook[5])();
      if ((RpcConnectionState *)CONCAT44(extraout_var,iVar2) == this) {
        RpcClient::callNoIntercept
                  (__return_storage_ptr__,(RpcClient *)capability->ptr,0xc8cb212fcd9f5691,0,context)
        ;
      }
      else {
        (**context->ptr->_vptr_CallContextHook)(&request);
        AnyPointer::Reader::
        getAs<capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveParams>
                  ((ReaderFor<capnp::Persistent<>::SaveParams> *)&params._reader,(Reader *)&request)
        ;
        MVar3 = StructReader::totalSize(&params._reader);
        local_48.ptr.field_1.value.capCount = MVar3.capCount + 1;
        local_48.ptr.field_1.value.wordCount = MVar3.wordCount + 2;
        local_48.ptr.isSet = true;
        RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
        Client::exportRequest(&request,&(this->gateway).ptr.field_1.value,&local_48);
        (*capability->ptr->_vptr_ClientHook[4])(local_158);
        local_128 = (Disposer *)local_158._8_8_;
        local_158._8_8_ = (Disposer *)0x0;
        local_138._8_8_ = local_158._0_8_;
        local_138._0_8_ = &Persistent<capnp::AnyPointer,capnp::AnyPointer>::Client::typeinfo;
        RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
        ExportParams::Builder::setCap(&request.super_Builder,(Client *)local_138);
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_138 + 8));
        kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_158);
        local_118 = params._reader.dataSize;
        SStack_114 = params._reader.pointerCount;
        uStack_112 = params._reader._38_2_;
        iStack_110 = params._reader.nestingLimit;
        uStack_10c = params._reader._44_4_;
        local_128 = (Disposer *)params._reader.data;
        pWStack_120 = params._reader.pointers;
        local_138._0_8_ = params._reader.segment;
        local_138._8_8_ = params._reader.capTable;
        local_158._16_8_ = request.super_Builder._builder.pointers + 1;
        local_158._0_8_ = request.super_Builder._builder.segment;
        local_158._8_8_ = request.super_Builder._builder.capTable;
        PointerBuilder::setStruct((PointerBuilder *)local_158,(StructReader *)local_138,false);
        (*context->ptr->_vptr_CallContextHook[4])();
        (*context->ptr->_vptr_CallContextHook[1])();
        request.hook.ptr = (RequestHook *)0x0;
        (*context->ptr->_vptr_CallContextHook[6])(__return_storage_ptr__);
        kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)local_138);
        kj::Own<capnp::RequestHook>::dispose(&request.hook);
      }
    }
  }
  else {
    (*capability->ptr->_vptr_ClientHook[1])
              (__return_storage_ptr__,capability->ptr,interfaceId,methodId & 0xffff,context);
  }
  return __return_storage_ptr__;
}

Assistant:

ClientHook::VoidPromiseAndPipeline startCall(
      uint64_t interfaceId, uint64_t methodId,
      kj::Own<ClientHook>&& capability, kj::Own<CallContextHook>&& context) {
    if (interfaceId == typeId<Persistent<>>() && methodId == 0) {
      KJ_IF_MAYBE(g, gateway) {
        // Wait, this is a call to Persistent.save() and we need to translate it through our
        // gateway.

        KJ_IF_MAYBE(resolvedPromise, capability->whenMoreResolved()) {
          // The plot thickens: We're looking at a promise capability. It could end up resolving
          // to a capability outside the gateway, in which case we don't want to translate at all.

          auto promises = resolvedPromise->then(kj::mvCapture(context,
              [this,interfaceId,methodId](kj::Own<CallContextHook>&& context,
                                          kj::Own<ClientHook> resolvedCap) {
            auto vpap = startCall(interfaceId, methodId, kj::mv(resolvedCap), kj::mv(context));
            return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
          })).attach(addRef(*this), kj::mv(capability)).split();

          return {
            kj::mv(kj::get<0>(promises)),
            newLocalPromisePipeline(kj::mv(kj::get<1>(promises))),
          };
        }

        if (capability->getBrand() == this) {
          // This capability is one of our own, pointing back out over the network. That means
          // that it would be inappropriate to apply the gateway transformation. We just want to
          // reflect the call back.
          return kj::downcast<RpcClient>(*capability)
              .callNoIntercept(interfaceId, methodId, kj::mv(context));
        }

        auto params = context->getParams().getAs<Persistent<>::SaveParams>();

        auto requestSize = params.totalSize();
        ++requestSize.capCount;
        requestSize.wordCount += sizeInWords<RealmGateway<>::ExportParams>();

        auto request = g->exportRequest(requestSize);
        request.setCap(Persistent<>::Client(capability->addRef()));
        request.setParams(params);

        context->allowCancellation();
        context->releaseParams();
        return context->directTailCall(RequestHook::from(kj::mv(request)));
      }
    }

    return capability->call(interfaceId, methodId, kj::mv(context));
  }